

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall efsw::String::String(String *this,wchar_t wideChar)

{
  (this->mString)._M_dataplus._M_p = (pointer)&(this->mString).field_2;
  (this->mString)._M_string_length = 0;
  (this->mString).field_2._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  push_back(&this->mString,wideChar);
  return;
}

Assistant:

String::String( wchar_t wideChar ) {
	mString += Utf32::DecodeWide( wideChar );
}